

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floatbits.h
# Opt level: O0

uint32_t float_to_bits(float a)

{
  anon_union_4_2_947300a4 x;
  float a_local;
  
  return (uint32_t)a;
}

Assistant:

static inline uint32_t float_to_bits(float a)
{
  union {
    float f;
    uint32_t i;
  } x;
  x.f = a;
  return x.i;
}